

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-opcodecnt.cc
# Opt level: O3

int ProgramMain(int argc,char **argv)

{
  _Rb_tree_node_base *p_Var1;
  char *pcVar2;
  Result RVar3;
  char *pcVar4;
  size_t sVar5;
  _Rb_tree_node_base *p_Var6;
  _Any_data *callback;
  OpcodeInfoCounts *__range1;
  uint uVar7;
  long lVar8;
  string_view filename;
  string_view filename_00;
  OpcodeInfoCounts counts;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  FileStream stream;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  _Rb_tree_node_base *local_e8;
  size_t local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  OptionParser local_b0;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&local_b0,"wasm-opcodecnt",
             "  Read a file in the wasm binary format, and count opcode usage for\n  instructions.\n\nexamples:\n  # parse binary file test.wasm and write pcode dist file test.dist\n  $ wasm-opcodecnt test.wasm -o test.dist\n"
            );
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = 0;
  local_f8._8_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:58:72)>
       ::_M_invoke;
  local_f8._0_8_ =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:58:72)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,'v',"verbose","Use multiple times for more info",(NullCallback *)local_108);
  if ((code *)local_f8._0_8_ != (code *)0x0) {
    (*(code *)local_f8._0_8_)(local_108,local_108,3);
  }
  wabt::Features::AddOptions(&s_features,&local_b0);
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = 0;
  local_f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:66:20)>
       ::_M_invoke;
  local_f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:66:20)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,'o',"output","FILENAME",
             "Output file for the opcode counts, by default use stdout",(Callback *)local_108);
  if ((code *)local_f8._0_8_ != (code *)0x0) {
    (*(code *)local_f8._0_8_)(local_108,local_108,3);
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = 0;
  local_f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:69:7)>
       ::_M_invoke;
  local_f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:69:7)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,'c',"cutoff","N","Cutoff for reporting counts less than N",
             (Callback *)local_108);
  if ((code *)local_f8._0_8_ != (code *)0x0) {
    (*(code *)local_f8._0_8_)(local_108,local_108,3);
  }
  local_108._0_8_ = (pointer)0x0;
  local_108._8_8_ = 0;
  local_f8._8_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:73:7)>
       ::_M_invoke;
  local_f8._0_8_ =
       std::
       _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:73:7)>
       ::_M_manager;
  wabt::OptionParser::AddOption
            (&local_b0,'s',"separator","SEPARATOR",
             "Separator text between element and count when reporting counts",(Callback *)local_108)
  ;
  if ((code *)local_f8._0_8_ != (code *)0x0) {
    (*(code *)local_f8._0_8_)(local_108,local_108,3);
  }
  local_f8._0_8_ = (_Link_type)0x656d616e656c6966;
  local_108._8_8_ = 8;
  local_f8._8_8_ = local_f8._8_8_ & 0xffffffffffffff00;
  callback = &local_d8;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:75:22)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/tools/wasm-opcodecnt.cc:75:22)>
             ::_M_manager;
  local_108._0_8_ = local_f8;
  wabt::OptionParser::AddArgument(&local_b0,(string *)local_108,OneOrMore,(Callback *)callback);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((undefined1 *)local_108._0_8_ != local_f8) {
    operator_delete((void *)local_108._0_8_);
  }
  wabt::OptionParser::Parse(&local_b0,argc,argv);
  if (local_b0.on_error_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b0.on_error_.super__Function_base._M_manager)
              ((_Any_data *)&local_b0.on_error_,(_Any_data *)&local_b0.on_error_,__destroy_functor);
  }
  std::vector<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>::~vector
            (&local_b0.arguments_);
  std::vector<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>::~vector
            (&local_b0.options_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.description_._M_dataplus._M_p != &local_b0.description_.field_2) {
    operator_delete(local_b0.description_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.program_name_._M_dataplus._M_p != &local_b0.program_name_.field_2) {
    operator_delete(local_b0.program_name_._M_dataplus._M_p);
  }
  pcVar2 = s_infile;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcVar4 = (char *)strlen(s_infile);
  filename.size_ = (size_type)&local_d8;
  filename.data_ = pcVar4;
  RVar3 = wabt::ReadFile((wabt *)pcVar2,filename,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)callback);
  pcVar2 = s_outfile;
  if (RVar3.enum_ == Error) {
    ProgramMain();
    uVar7 = 1;
  }
  else {
    if (s_outfile == (char *)0x0) {
      wabt::FileStream::FileStream((FileStream *)&local_b0,_stdout,(Stream *)0x0);
    }
    else {
      sVar5 = strlen(s_outfile);
      filename_00.size_ = sVar5;
      filename_00.data_ = pcVar2;
      wabt::FileStream::FileStream((FileStream *)&local_b0,filename_00,(Stream *)0x0);
    }
    uVar7 = 1;
    if (RVar3.enum_ == Ok) {
      p_Var1 = (_Rb_tree_node_base *)(local_108 + 8);
      local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
      local_f8._0_8_ = (_Link_type)0x0;
      local_e0 = 0;
      s_read_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
      s_read_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
      s_read_binary_options.features.sat_float_to_int_enabled_ =
           s_features.sat_float_to_int_enabled_;
      s_read_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
      s_read_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
      s_read_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
      s_read_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
      s_read_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
      s_read_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
      s_read_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
      s_read_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
      s_read_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
      s_read_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
      local_f8._8_8_ = p_Var1;
      local_e8 = p_Var1;
      RVar3 = wabt::ReadBinaryOpcnt
                        (local_d8._M_unused._M_object,local_d8._8_8_ - local_d8._0_8_,
                         &s_read_binary_options,(OpcodeInfoCounts *)local_108);
      if (RVar3.enum_ == Ok) {
        lVar8 = 0;
        for (p_Var6 = (_Rb_tree_node_base *)local_f8._8_8_; p_Var6 != p_Var1;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          lVar8 = lVar8 + *(long *)(p_Var6 + 2);
        }
        wabt::Stream::Writef((Stream *)&local_b0,"Total opcodes: %zd\n\n",lVar8);
        wabt::Stream::Writef((Stream *)&local_b0,"Opcode counts:\n");
        WriteCounts((Stream *)&local_b0,(OpcodeInfoCounts *)local_108);
        wabt::Stream::Writef((Stream *)&local_b0,"\nOpcode counts with immediates:\n");
        WriteCountsWithImmediates((Stream *)&local_b0,(OpcodeInfoCounts *)local_108);
      }
      std::
      _Rb_tree<wabt::OpcodeInfo,_std::pair<const_wabt::OpcodeInfo,_unsigned_long>,_std::_Select1st<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
      ::_M_erase((_Rb_tree<wabt::OpcodeInfo,_std::pair<const_wabt::OpcodeInfo,_unsigned_long>,_std::_Select1st<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_std::less<wabt::OpcodeInfo>,_std::allocator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>_>
                  *)local_108,(_Link_type)local_f8._0_8_);
      uVar7 = (uint)(RVar3.enum_ != Ok);
    }
    wabt::FileStream::~FileStream((FileStream *)&local_b0);
  }
  if (local_d8._M_unused._M_object != (void *)0x0) {
    operator_delete(local_d8._M_unused._M_object);
  }
  return uVar7;
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();
  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  if (Failed(result)) {
    const char* input_name = s_infile ? s_infile : "stdin";
    ERROR("Unable to parse: %s", input_name);
    return 1;
  }

  FileStream stream(s_outfile ? FileStream(s_outfile) : FileStream(stdout));

  if (Succeeded(result)) {
    OpcodeInfoCounts counts;
    s_read_binary_options.features = s_features;
    result = ReadBinaryOpcnt(file_data.data(), file_data.size(),
                             s_read_binary_options, &counts);
    if (Succeeded(result)) {
      stream.Writef("Total opcodes: %" PRIzd "\n\n", SumCounts(counts));

      stream.Writef("Opcode counts:\n");
      WriteCounts(stream, counts);

      stream.Writef("\nOpcode counts with immediates:\n");
      WriteCountsWithImmediates(stream, counts);
    }
  }

  return result != Result::Ok;
}